

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_memfill16(quint16 *dest,quint16 value,qsizetype count)

{
  ulong in_RDX;
  undefined2 in_SI;
  quint32 *in_RDI;
  quint32 value32;
  int align;
  ulong local_18;
  quint32 *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (((ulong)in_RDI & 3) != 0) {
    local_8 = (quint32 *)((long)in_RDI + 2);
    *(undefined2 *)in_RDI = in_SI;
    local_18 = in_RDX - 1;
  }
  if ((local_18 & 1) != 0) {
    *(undefined2 *)((long)local_8 + (local_18 - 1) * 2) = in_SI;
  }
  (*qt_memfill32)(local_8,CONCAT22(in_SI,in_SI),(long)local_18 / 2);
  return;
}

Assistant:

void qt_memfill16(quint16 *dest, quint16 value, qsizetype count)
{
    const int align = quintptr(dest) & 0x3;
    if (align) {
        *dest++ = value;
        --count;
    }

    if (count & 0x1)
        dest[count - 1] = value;

    const quint32 value32 = (value << 16) | value;
    qt_memfill32(reinterpret_cast<quint32*>(dest), value32, count / 2);
}